

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfVecAttribute.cpp
# Opt level: O1

void __thiscall
Imf_2_5::TypedAttribute<Imath_2_5::Vec2<float>_>::readValueFrom
          (TypedAttribute<Imath_2_5::Vec2<float>_> *this,IStream *is,int size,int version)

{
  uchar b [4];
  uchar b_1 [4];
  float local_20;
  float local_1c;
  
  (*is->_vptr_IStream[3])(is,&local_20,4);
  (this->_value).x = local_20;
  (*is->_vptr_IStream[3])(is,&local_1c,4);
  (this->_value).y = local_1c;
  return;
}

Assistant:

void
V2fAttribute::readValueFrom (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream &is, int size, int version)
{
    Xdr::read <StreamIO> (is, _value.x);
    Xdr::read <StreamIO> (is, _value.y);
}